

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_fill_mode_rates(AV1_COMMON *cm,ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  int (*paaiVar1) [2] [16];
  int (*costs) [2] [16];
  int *piVar2;
  uint uVar3;
  int u;
  int iVar4;
  int (*paaiVar5) [13] [13];
  int (*paaiVar6) [13] [14];
  ulong uVar7;
  aom_cdf_prob (*paaaVar8) [5] [9];
  int (*paaiVar9) [3] [5];
  aom_cdf_prob (*paaaaVar10) [4] [13] [17];
  int (*paaiVar11) [6] [2];
  int (*paaiVar12) [3] [3];
  int (*paaiVar13) [3] [2];
  int (*paaiVar14) [2] [2];
  aom_cdf_prob (*paaVar15) [3];
  ModeCosts *pMVar16;
  int (*costs_00) [13] [13];
  int (*costs_01) [13];
  int (*costs_02) [13] [14];
  int (*paiVar17) [3];
  int (*paaiVar18) [3] [2];
  aom_cdf_prob (*cdf) [5] [9];
  int (*costs_03) [3] [5];
  int (*paiVar19) [2];
  aom_cdf_prob (*paaaVar20) [4] [17];
  aom_cdf_prob (*cdf_00) [4] [17];
  int (*costs_04) [7];
  int (*costs_05) [8];
  segmentation_probs *cdf_01;
  aom_cdf_prob (*cdf_02) [17];
  long lVar21;
  int (*paaiVar22) [4] [16];
  int (*costs_06) [4] [16];
  int (*costs_07) [4] [13] [16];
  aom_cdf_prob (*cdf_03) [5];
  long lVar23;
  aom_cdf_prob (*paaaVar24) [5] [14];
  aom_cdf_prob (*paaaVar25) [13] [15];
  aom_cdf_prob (*paaaVar26) [3] [4];
  long lVar27;
  aom_cdf_prob (*paaaVar28) [6] [3];
  aom_cdf_prob (*paaaVar29) [3] [3];
  aom_cdf_prob (*paaaVar30) [2] [3];
  int (*paaiVar31) [2] [16];
  int (*paaaiVar32) [4] [13] [16];
  int (*paaaiVar33) [4] [13] [16];
  int (*costs_08) [6] [2];
  int (*costs_09) [3] [3];
  int (*costs_10) [2] [2];
  aom_cdf_prob (*cdf_04) [9];
  int (*paiVar34) [16];
  aom_cdf_prob (*cdf_05) [4];
  long local_98;
  aom_cdf_prob (*local_90) [4] [13] [17];
  int sign_cost [8];
  
  pMVar16 = mode_costs;
  for (lVar23 = 0; lVar23 != 0x1b8; lVar23 = lVar23 + 0x16) {
    av1_cost_tokens_from_cdf
              ((int *)pMVar16,(aom_cdf_prob *)((long)fc->partition_cdf[0] + lVar23),(int *)0x0);
    pMVar16 = (ModeCosts *)(pMVar16->partition_cost + 1);
  }
  if ((cm->current_frame).skip_mode_info.skip_mode_flag != 0) {
    paaVar15 = fc->skip_mode_cdfs;
    for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->skip_mode_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
  }
  paaVar15 = fc->skip_txfm_cdfs;
  for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 8) {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->skip_txfm_cost[0] + lVar23),*paaVar15,(int *)0x0);
    paaVar15 = paaVar15 + 1;
  }
  paaiVar5 = mode_costs->y_mode_costs;
  paaaVar24 = fc->kf_y_cdf;
  for (lVar23 = 0; lVar23 != 5; lVar23 = lVar23 + 1) {
    costs_00 = paaiVar5;
    for (lVar21 = 0; lVar21 != 0x8c; lVar21 = lVar21 + 0x1c) {
      av1_cost_tokens_from_cdf
                ((int *)costs_00,(aom_cdf_prob *)((long)(*paaaVar24)[0] + lVar21),(int *)0x0);
      costs_00 = (int (*) [13] [13])(*costs_00 + 1);
    }
    paaiVar5 = paaiVar5 + 1;
    paaaVar24 = paaaVar24 + 1;
  }
  costs_01 = mode_costs->mbmode_cost;
  for (lVar23 = 0; lVar23 != 0x70; lVar23 = lVar23 + 0x1c) {
    av1_cost_tokens_from_cdf
              (*costs_01,(aom_cdf_prob *)((long)fc->y_mode_cdf[0] + lVar23),(int *)0x0);
    costs_01 = costs_01 + 1;
  }
  paaiVar6 = mode_costs->intra_uv_mode_cost;
  paaaVar25 = fc->uv_mode_cdf;
  for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
    costs_02 = paaiVar6;
    for (lVar21 = 0; lVar21 != 0x186; lVar21 = lVar21 + 0x1e) {
      av1_cost_tokens_from_cdf
                ((int *)costs_02,(aom_cdf_prob *)((long)(*paaaVar25)[0] + lVar21),(int *)0x0);
      costs_02 = (int (*) [13] [14])(*costs_02 + 1);
    }
    paaiVar6 = paaiVar6 + 1;
    paaaVar25 = paaaVar25 + 1;
  }
  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,fc->filter_intra_mode_cdf,(int *)0x0);
  paiVar19 = mode_costs->filter_intra_cost;
  paaVar15 = fc->filter_intra_cdfs;
  for (uVar7 = 0; uVar7 != 0x16; uVar7 = uVar7 + 1) {
    if (((cm->seq_params->enable_filter_intra != '\0') && ((0x1f07ffUL >> (uVar7 & 0x3f) & 1) != 0))
       && ((0x2f0bffUL >> (uVar7 & 0x3f) & 1) != 0)) {
      av1_cost_tokens_from_cdf(*paiVar19,*paaVar15,(int *)0x0);
    }
    paaVar15 = paaVar15 + 1;
    paiVar19 = paiVar19 + 1;
  }
  paiVar17 = mode_costs->switchable_interp_costs;
  for (lVar23 = 0; lVar23 != 0x80; lVar23 = lVar23 + 8) {
    av1_cost_tokens_from_cdf
              (*paiVar17,(aom_cdf_prob *)((long)fc->switchable_interp_cdf[0] + lVar23),(int *)0x0);
    paiVar17 = paiVar17 + 1;
  }
  paaiVar13 = mode_costs->palette_y_mode_cost;
  paaaVar29 = fc->palette_y_mode_cdf;
  for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
    av1_cost_tokens_from_cdf
              (mode_costs->palette_y_size_cost[lVar23],fc->palette_y_size_cdf[lVar23],(int *)0x0);
    av1_cost_tokens_from_cdf
              (mode_costs->palette_uv_size_cost[lVar23],fc->palette_uv_size_cdf[lVar23],(int *)0x0);
    paaiVar18 = paaiVar13;
    for (lVar21 = 0; lVar21 != 0x12; lVar21 = lVar21 + 6) {
      av1_cost_tokens_from_cdf
                ((int *)paaiVar18,(aom_cdf_prob *)((long)(*paaaVar29)[0] + lVar21),(int *)0x0);
      paaiVar18 = (int (*) [3] [2])(*paaiVar18 + 1);
    }
    paaiVar13 = paaiVar13 + 1;
    paaaVar29 = paaaVar29 + 1;
  }
  paaVar15 = fc->palette_uv_mode_cdf;
  for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 8) {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->palette_uv_mode_cost[0] + lVar23),*paaVar15,(int *)0x0);
    paaVar15 = paaVar15 + 1;
  }
  paaaVar8 = fc->palette_y_color_index_cdf;
  pMVar16 = mode_costs;
  for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
    cdf = paaaVar8;
    for (lVar21 = 0; lVar21 != 0xa0; lVar21 = lVar21 + 0x20) {
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar16->palette_y_color_cost[0][0] + lVar21),(aom_cdf_prob *)cdf,
                 (int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar16->palette_uv_color_cost[0][0] + lVar21),
                 (aom_cdf_prob *)(cdf + 7),(int *)0x0);
      cdf = (aom_cdf_prob (*) [5] [9])(*cdf + 1);
    }
    pMVar16 = (ModeCosts *)(pMVar16->partition_cost + 4);
    paaaVar8 = paaaVar8 + 1;
  }
  av1_cost_tokens_from_cdf(sign_cost,fc->cfl_sign_cdf,(int *)0x0);
  paaiVar1 = mode_costs->cfl_cost;
  uVar7 = 0;
  paaiVar31 = paaiVar1;
  while (uVar7 != 8) {
    costs = paaiVar1 + uVar7;
    if (uVar7 < 2) {
      ((int *)((long)costs + 0))[0xc] = 0;
      ((int *)((long)costs + 0))[0xd] = 0;
      ((int *)((long)costs + 0))[0xe] = 0;
      ((int *)((long)costs + 0))[0xf] = 0;
      ((int *)((long)costs + 0))[8] = 0;
      ((int *)((long)costs + 0))[9] = 0;
      ((int *)((long)costs + 0))[10] = 0;
      ((int *)((long)costs + 0))[0xb] = 0;
      ((int *)((long)costs + 0))[4] = 0;
      ((int *)((long)costs + 0))[5] = 0;
      ((int *)((long)costs + 0))[6] = 0;
      ((int *)((long)costs + 0))[7] = 0;
      ((int *)((long)costs + 0))[0] = 0;
      ((int *)((long)costs + 0))[1] = 0;
      ((int *)((long)costs + 0))[2] = 0;
      ((int *)((long)costs + 0))[3] = 0;
    }
    else {
      av1_cost_tokens_from_cdf((int *)costs,fc->cfl_sign_cdf + uVar7 * 0x11 + -0x19,(int *)0x0);
    }
    paiVar34 = paaiVar1[uVar7] + 1;
    iVar4 = (int)(uVar7 + 1);
    uVar3 = (uint)(iVar4 * 0xb) >> 5;
    iVar4 = uVar3 * -3 + iVar4;
    if (iVar4 == 0) {
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x30) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x34) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x38) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x3c) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x20) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x24) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x28) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x2c) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x10) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x14) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x18) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0x1c) = 0;
      *(int *)((long)paiVar34 + 0) = 0;
      *(int *)((long)paiVar34 + 4) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 8) = 0;
      *(int *)((long)(paaiVar1[uVar7] + 1) + 0xc) = 0;
    }
    else {
      av1_cost_tokens_from_cdf
                (*paiVar34,fc->cfl_alpha_cdf[(int)(uVar3 + iVar4 * 3 + -3)],(int *)0x0);
    }
    iVar4 = sign_cost[uVar7];
    for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 1) {
      piVar2 = (*paaiVar31)[0] + lVar23;
      *piVar2 = *piVar2 + iVar4;
    }
    paaiVar31 = paaiVar31 + 1;
    uVar7 = uVar7 + 1;
  }
  paaiVar9 = mode_costs->tx_size_cost;
  paaaVar26 = fc->tx_size_cdf;
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    costs_03 = paaiVar9;
    for (lVar21 = 0; lVar21 != 0x18; lVar21 = lVar21 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)costs_03,(aom_cdf_prob *)((long)(*paaaVar26)[0] + lVar21),(int *)0x0);
      costs_03 = (int (*) [3] [5])(*costs_03 + 1);
    }
    paaiVar9 = paaiVar9 + 1;
    paaaVar26 = paaaVar26 + 1;
  }
  paiVar19 = mode_costs->txfm_partition_cost;
  for (lVar23 = 0; lVar23 != 0x7e; lVar23 = lVar23 + 6) {
    av1_cost_tokens_from_cdf
              (*paiVar19,(aom_cdf_prob *)((long)fc->txfm_partition_cdf[0] + lVar23),(int *)0x0);
    paiVar19 = paiVar19 + 1;
  }
  paaiVar22 = mode_costs->inter_tx_type_costs + 1;
  paaaVar20 = fc->inter_ext_tx_cdf + 1;
  paaaiVar32 = mode_costs->intra_tx_type_costs + 1;
  local_90 = fc->intra_ext_tx_cdf + 1;
  local_98 = 0xc0c4d0;
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    cdf_00 = paaaVar20;
    costs_06 = paaiVar22;
    for (lVar21 = 0; lVar21 != 0xc; lVar21 = lVar21 + 4) {
      if (*(int *)(local_98 + lVar21 * 4) != 0) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_06,(aom_cdf_prob *)cdf_00,
                   av1_ext_tx_inv[*(int *)((long)av1_ext_tx_set_idx_to_type[1] + lVar21 + 4)]);
      }
      costs_06 = costs_06 + 1;
      cdf_00 = cdf_00 + 1;
    }
    paaaaVar10 = local_90;
    paaaiVar33 = paaaiVar32;
    for (lVar21 = 1; lVar21 != 3; lVar21 = lVar21 + 1) {
      if (use_intra_ext_tx_for_txsize[lVar21][lVar23] != 0) {
        iVar4 = av1_ext_tx_set_idx_to_type[0][lVar21];
        costs_07 = paaaiVar33;
        for (lVar27 = 0; lVar27 != 0x1ba; lVar27 = lVar27 + 0x22) {
          av1_cost_tokens_from_cdf
                    ((int *)costs_07,(aom_cdf_prob *)((long)(*paaaaVar10)[0][0] + lVar27),
                     av1_ext_tx_inv[iVar4]);
          costs_07 = (int (*) [4] [13] [16])((*costs_07)[0] + 1);
        }
      }
      paaaiVar33 = paaaiVar33 + 1;
      paaaaVar10 = paaaaVar10 + 1;
    }
    local_98 = local_98 + 4;
    paaiVar22 = (int (*) [4] [16])(*paaiVar22 + 1);
    paaaVar20 = (aom_cdf_prob (*) [4] [17])(*paaaVar20 + 1);
    paaaiVar32 = (int (*) [4] [13] [16])(*paaaiVar32 + 1);
    local_90 = (aom_cdf_prob (*) [4] [13] [17])(*local_90 + 1);
  }
  costs_04 = mode_costs->angle_delta_cost;
  for (lVar23 = 0; lVar23 != 0x80; lVar23 = lVar23 + 0x10) {
    av1_cost_tokens_from_cdf
              (*costs_04,(aom_cdf_prob *)((long)fc->angle_delta_cdf[0] + lVar23),(int *)0x0);
    costs_04 = costs_04 + 1;
  }
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost,fc->intrabc_cdf,(int *)0x0);
  costs_05 = mode_costs->spatial_pred_cost;
  for (lVar23 = 0; lVar23 != 0x36; lVar23 = lVar23 + 0x12) {
    av1_cost_tokens_from_cdf
              (*costs_05,(aom_cdf_prob *)((long)(fc->seg).spatial_pred_seg_cdf[0] + lVar23),
               (int *)0x0);
    costs_05 = costs_05 + 1;
  }
  cdf_01 = &fc->seg;
  for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 8) {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->tmp_pred_cost[0] + lVar23),(aom_cdf_prob *)cdf_01,
               (int *)0x0);
    cdf_01 = (segmentation_probs *)(cdf_01->pred_cdf + 1);
  }
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    paiVar19 = mode_costs->comp_inter_cost;
    for (lVar23 = 0; lVar23 != 0x1e; lVar23 = lVar23 + 6) {
      av1_cost_tokens_from_cdf
                (*paiVar19,(aom_cdf_prob *)((long)fc->comp_inter_cdf[0] + lVar23),(int *)0x0);
      paiVar19 = paiVar19 + 1;
    }
    paaiVar11 = mode_costs->single_ref_cost;
    paaaVar28 = fc->single_ref_cdf;
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      costs_08 = paaiVar11;
      for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 6) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_08,(aom_cdf_prob *)((long)(*paaaVar28)[0] + lVar21),(int *)0x0);
        costs_08 = (int (*) [6] [2])(*costs_08 + 1);
      }
      paaiVar11 = paaiVar11 + 1;
      paaaVar28 = paaaVar28 + 1;
    }
    paiVar17 = mode_costs->comp_ref_type_cost;
    for (lVar23 = 0; lVar23 != 0x1e; lVar23 = lVar23 + 6) {
      av1_cost_tokens_from_cdf
                (*paiVar17,(aom_cdf_prob *)((long)fc->comp_ref_type_cdf[0] + lVar23),(int *)0x0);
      paiVar17 = paiVar17 + 1;
    }
    paaiVar12 = mode_costs->uni_comp_ref_cost;
    paaaVar29 = fc->uni_comp_ref_cdf;
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      costs_09 = paaiVar12;
      for (lVar21 = 0; lVar21 != 0x12; lVar21 = lVar21 + 6) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_09,(aom_cdf_prob *)((long)(*paaaVar29)[0] + lVar21),(int *)0x0);
        costs_09 = (int (*) [3] [3])(*costs_09 + 1);
      }
      paaiVar12 = paaiVar12 + 1;
      paaaVar29 = paaaVar29 + 1;
    }
    paaiVar13 = mode_costs->comp_ref_cost;
    paaaVar29 = fc->comp_ref_cdf;
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      paaiVar18 = paaiVar13;
      for (lVar21 = 0; lVar21 != 0x12; lVar21 = lVar21 + 6) {
        av1_cost_tokens_from_cdf
                  ((int *)paaiVar18,(aom_cdf_prob *)((long)(*paaaVar29)[0] + lVar21),(int *)0x0);
        paaiVar18 = (int (*) [3] [2])(*paaiVar18 + 1);
      }
      paaiVar13 = paaiVar13 + 1;
      paaaVar29 = paaaVar29 + 1;
    }
    paaiVar14 = mode_costs->comp_bwdref_cost;
    paaaVar30 = fc->comp_bwdref_cdf;
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      costs_10 = paaiVar14;
      for (lVar21 = 0; lVar21 != 0xc; lVar21 = lVar21 + 6) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_10,(aom_cdf_prob *)((long)(*paaaVar30)[0] + lVar21),(int *)0x0);
        costs_10 = (int (*) [2] [2])(*costs_10 + 1);
      }
      paaiVar14 = paaiVar14 + 1;
      paaaVar30 = paaaVar30 + 1;
    }
    paaVar15 = fc->intra_inter_cdf;
    for (lVar23 = 0; lVar23 != 0x20; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->intra_inter_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paaVar15 = fc->newmv_cdf;
    for (lVar23 = 0; lVar23 != 0x30; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->newmv_mode_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paaVar15 = fc->zeromv_cdf;
    for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->zeromv_mode_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paaVar15 = fc->refmv_cdf;
    for (lVar23 = 0; lVar23 != 0x30; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->refmv_mode_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paaVar15 = fc->drl_cdf;
    for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->drl_mode_cost0[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    cdf_04 = fc->inter_compound_mode_cdf;
    for (lVar23 = 0; lVar23 != 0x100; lVar23 = lVar23 + 0x20) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->inter_compound_mode_cost[0] + lVar23),*cdf_04,(int *)0x0)
      ;
      cdf_04 = cdf_04 + 1;
    }
    paaVar15 = fc->compound_type_cdf;
    for (lVar23 = 0; lVar23 != 0xb0; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->compound_type_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paiVar34 = mode_costs->wedge_idx_cost;
    cdf_02 = fc->wedge_idx_cdf;
    for (lVar23 = 0; lVar23 != 0x2c0; lVar23 = lVar23 + 0x20) {
      if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + lVar23)) {
        av1_cost_tokens_from_cdf(*paiVar34,*cdf_02,(int *)0x0);
      }
      cdf_02 = cdf_02 + 1;
      paiVar34 = paiVar34 + 1;
    }
    paiVar19 = mode_costs->interintra_cost;
    paaVar15 = fc->interintra_cdf;
    cdf_03 = fc->interintra_mode_cdf;
    for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 0x10) {
      av1_cost_tokens_from_cdf(*paiVar19,*paaVar15,(int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->interintra_mode_cost[0] + lVar23),*cdf_03,(int *)0x0);
      cdf_03 = cdf_03 + 1;
      paaVar15 = paaVar15 + 1;
      paiVar19 = paiVar19 + 1;
    }
    paaVar15 = fc->wedge_interintra_cdf;
    for (lVar23 = 0; lVar23 != 0xb0; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->wedge_interintra_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    cdf_05 = fc->motion_mode_cdf + 3;
    for (lVar23 = 0; lVar23 != 0xe4; lVar23 = lVar23 + 0xc) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->motion_mode_cost[3] + lVar23),*cdf_05,(int *)0x0);
      cdf_05 = cdf_05 + 1;
    }
    paiVar19 = mode_costs->motion_mode_cost1 + 3;
    for (lVar23 = 0; lVar23 != 0x72; lVar23 = lVar23 + 6) {
      av1_cost_tokens_from_cdf
                (*paiVar19,(aom_cdf_prob *)((long)fc->obmc_cdf[3] + lVar23),(int *)0x0);
      paiVar19 = paiVar19 + 1;
    }
    paaVar15 = fc->compound_index_cdf;
    for (lVar23 = 0; lVar23 != 0x30; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_idx_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
    paaVar15 = fc->comp_group_idx_cdf;
    for (lVar23 = 0; lVar23 != 0x30; lVar23 = lVar23 + 8) {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_group_idx_cost[0] + lVar23),*paaVar15,(int *)0x0);
      paaVar15 = paaVar15 + 1;
    }
  }
  return;
}

Assistant:

void av1_fill_mode_rates(AV1_COMMON *const cm, ModeCosts *mode_costs,
                         FRAME_CONTEXT *fc) {
  int i, j;

  for (i = 0; i < PARTITION_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->partition_cost[i],
                             fc->partition_cdf[i], NULL);

  if (cm->current_frame.skip_mode_info.skip_mode_flag) {
    for (i = 0; i < SKIP_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->skip_mode_cost[i],
                               fc->skip_mode_cdfs[i], NULL);
    }
  }

  for (i = 0; i < SKIP_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->skip_txfm_cost[i],
                             fc->skip_txfm_cdfs[i], NULL);
  }

  for (i = 0; i < KF_MODE_CONTEXTS; ++i)
    for (j = 0; j < KF_MODE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->y_mode_costs[i][j],
                               fc->kf_y_cdf[i][j], NULL);

  for (i = 0; i < BLOCK_SIZE_GROUPS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->mbmode_cost[i], fc->y_mode_cdf[i],
                             NULL);
  for (i = 0; i < CFL_ALLOWED_TYPES; ++i)
    for (j = 0; j < INTRA_MODES; ++j)
      av1_cost_tokens_from_cdf(mode_costs->intra_uv_mode_cost[i][j],
                               fc->uv_mode_cdf[i][j], NULL);

  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,
                           fc->filter_intra_mode_cdf, NULL);
  for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
    if (av1_filter_intra_allowed_bsize(cm, i))
      av1_cost_tokens_from_cdf(mode_costs->filter_intra_cost[i],
                               fc->filter_intra_cdfs[i], NULL);
  }

  for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->switchable_interp_costs[i],
                             fc->switchable_interp_cdf[i], NULL);

  for (i = 0; i < PALATTE_BSIZE_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_y_size_cost[i],
                             fc->palette_y_size_cdf[i], NULL);
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_size_cost[i],
                             fc->palette_uv_size_cdf[i], NULL);
    for (j = 0; j < PALETTE_Y_MODE_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_mode_cost[i][j],
                               fc->palette_y_mode_cdf[i][j], NULL);
    }
  }

  for (i = 0; i < PALETTE_UV_MODE_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_mode_cost[i],
                             fc->palette_uv_mode_cdf[i], NULL);
  }

  for (i = 0; i < PALETTE_SIZES; ++i) {
    for (j = 0; j < PALETTE_COLOR_INDEX_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_color_cost[i][j],
                               fc->palette_y_color_index_cdf[i][j], NULL);
      av1_cost_tokens_from_cdf(mode_costs->palette_uv_color_cost[i][j],
                               fc->palette_uv_color_index_cdf[i][j], NULL);
    }
  }

  int sign_cost[CFL_JOINT_SIGNS];
  av1_cost_tokens_from_cdf(sign_cost, fc->cfl_sign_cdf, NULL);
  for (int joint_sign = 0; joint_sign < CFL_JOINT_SIGNS; joint_sign++) {
    int *cost_u = mode_costs->cfl_cost[joint_sign][CFL_PRED_U];
    int *cost_v = mode_costs->cfl_cost[joint_sign][CFL_PRED_V];
    if (CFL_SIGN_U(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_u, 0, CFL_ALPHABET_SIZE * sizeof(*cost_u));
    } else {
      const aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
      av1_cost_tokens_from_cdf(cost_u, cdf_u, NULL);
    }
    if (CFL_SIGN_V(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_v, 0, CFL_ALPHABET_SIZE * sizeof(*cost_v));
    } else {
      const aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
      av1_cost_tokens_from_cdf(cost_v, cdf_v, NULL);
    }
    for (int u = 0; u < CFL_ALPHABET_SIZE; u++)
      cost_u[u] += sign_cost[joint_sign];
  }

  for (i = 0; i < MAX_TX_CATS; ++i)
    for (j = 0; j < TX_SIZE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->tx_size_cost[i][j],
                               fc->tx_size_cdf[i][j], NULL);

  for (i = 0; i < TXFM_PARTITION_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->txfm_partition_cost[i],
                             fc->txfm_partition_cdf[i], NULL);
  }

  for (i = TX_4X4; i < EXT_TX_SIZES; ++i) {
    int s;
    for (s = 1; s < EXT_TX_SETS_INTER; ++s) {
      if (use_inter_ext_tx_for_txsize[s][i]) {
        av1_cost_tokens_from_cdf(
            mode_costs->inter_tx_type_costs[s][i], fc->inter_ext_tx_cdf[s][i],
            av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[1][s]]);
      }
    }
    for (s = 1; s < EXT_TX_SETS_INTRA; ++s) {
      if (use_intra_ext_tx_for_txsize[s][i]) {
        for (j = 0; j < INTRA_MODES; ++j) {
          av1_cost_tokens_from_cdf(
              mode_costs->intra_tx_type_costs[s][i][j],
              fc->intra_ext_tx_cdf[s][i][j],
              av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[0][s]]);
        }
      }
    }
  }
  for (i = 0; i < DIRECTIONAL_MODES; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->angle_delta_cost[i],
                             fc->angle_delta_cdf[i], NULL);
  }
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost, fc->intrabc_cdf, NULL);

  for (i = 0; i < SPATIAL_PREDICTION_PROBS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->spatial_pred_cost[i],
                             fc->seg.spatial_pred_seg_cdf[i], NULL);
  }

  for (i = 0; i < SEG_TEMPORAL_PRED_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->tmp_pred_cost[i], fc->seg.pred_cdf[i],
                             NULL);
  }

  if (!frame_is_intra_only(cm)) {
    for (i = 0; i < COMP_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_inter_cost[i],
                               fc->comp_inter_cdf[i], NULL);
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < SINGLE_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->single_ref_cost[i][j],
                                 fc->single_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < COMP_REF_TYPE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_ref_type_cost[i],
                               fc->comp_ref_type_cdf[i], NULL);
    }

    for (i = 0; i < UNI_COMP_REF_CONTEXTS; ++i) {
      for (j = 0; j < UNIDIR_COMP_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->uni_comp_ref_cost[i][j],
                                 fc->uni_comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < FWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_ref_cost[i][j],
                                 fc->comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < BWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_bwdref_cost[i][j],
                                 fc->comp_bwdref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < INTRA_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->intra_inter_cost[i],
                               fc->intra_inter_cdf[i], NULL);
    }

    for (i = 0; i < NEWMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->newmv_mode_cost[i], fc->newmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < GLOBALMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[i],
                               fc->zeromv_cdf[i], NULL);
    }

    for (i = 0; i < REFMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->refmv_mode_cost[i], fc->refmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < DRL_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->drl_mode_cost0[i], fc->drl_cdf[i],
                               NULL);
    }
    for (i = 0; i < INTER_MODE_CONTEXTS; ++i)
      av1_cost_tokens_from_cdf(mode_costs->inter_compound_mode_cost[i],
                               fc->inter_compound_mode_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i)
      av1_cost_tokens_from_cdf(mode_costs->compound_type_cost[i],
                               fc->compound_type_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      if (av1_is_wedge_used(i)) {
        av1_cost_tokens_from_cdf(mode_costs->wedge_idx_cost[i],
                                 fc->wedge_idx_cdf[i], NULL);
      }
    }
    for (i = 0; i < BLOCK_SIZE_GROUPS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->interintra_cost[i],
                               fc->interintra_cdf[i], NULL);
      av1_cost_tokens_from_cdf(mode_costs->interintra_mode_cost[i],
                               fc->interintra_mode_cdf[i], NULL);
    }
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->wedge_interintra_cost[i],
                               fc->wedge_interintra_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost[i],
                               fc->motion_mode_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost1[i],
                               fc->obmc_cdf[i], NULL);
    }
    for (i = 0; i < COMP_INDEX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_idx_cost[i],
                               fc->compound_index_cdf[i], NULL);
    }
    for (i = 0; i < COMP_GROUP_IDX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_group_idx_cost[i],
                               fc->comp_group_idx_cdf[i], NULL);
    }
  }
}